

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

string * __thiscall
toml::detail::location<std::vector<char,std::allocator<char>>>::line_num_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  location<std::vector<char,_std::allocator<char>_>_> *this_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,*(unsigned_long *)((long)this + 0x18));
  return __return_storage_ptr__;
}

Assistant:

std::string line_num() const override
    {
        return std::to_string(this->line_number_);
    }